

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O2

void __thiscall
cppjieba::KeywordExtractor::Extract
          (KeywordExtractor *this,string *sentence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywords,size_t topN)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  topWords;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  local_38;
  
  local_38.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Extract(this,sentence,&local_38,topN);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_38.
                            super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38.
                            super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6); uVar2 = uVar2 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(keywords,(value_type *)
                         ((long)&((local_38.
                                   super__Vector_base<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus.
                                 _M_p + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector(&local_38);
  return;
}

Assistant:

void Extract(const string& sentence, vector<string>& keywords, size_t topN) const {
    vector<Word> topWords;
    Extract(sentence, topWords, topN);
    for (size_t i = 0; i < topWords.size(); i++) {
      keywords.push_back(topWords[i].word);
    }
  }